

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRemoveCommand.h
# Opt level: O0

cmCommand * __thiscall cmRemoveCommand::Clone(cmRemoveCommand *this)

{
  cmCommand *this_00;
  cmRemoveCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmRemoveCommand((cmRemoveCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmRemoveCommand; }